

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void writePrimalSolution<double>
               (SoPlexBase<double> *soplex,char *filename,NameSet *colnames,NameSet *rownames,
               bool real,bool rational,bool append)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  element_type *peVar6;
  double *pdVar7;
  void *pvVar8;
  char *pcVar9;
  ostream *poVar10;
  _Ios_Openmode in_ESI;
  byte in_R8B;
  byte in_R9B;
  Real RVar11;
  double dVar12;
  byte in_stack_00000008;
  int i_3;
  int nNonzeros_1;
  int i_2;
  VectorRational primal_1;
  int i_1;
  int nNonzeros;
  int i;
  VectorBase<double> primal;
  ofstream outfile;
  int printwidth;
  int printprec;
  SoPlexBase<double> *in_stack_fffffffffffff9c8;
  SoPlexBase<double> *in_stack_fffffffffffff9d0;
  SoPlexBase<double> *in_stack_fffffffffffff9d8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffffa18;
  undefined2 in_stack_fffffffffffffa1c;
  undefined1 in_stack_fffffffffffffa1e;
  undefined1 in_stack_fffffffffffffa1f;
  ostream *in_stack_fffffffffffffa20;
  ostream *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa58;
  byte in_stack_fffffffffffffa5f;
  ostream *in_stack_fffffffffffffa60;
  undefined4 local_3fc;
  undefined1 local_3f8 [76];
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  undefined4 local_39c;
  undefined1 local_398 [68];
  int local_354;
  int local_334;
  int local_31c;
  int local_318;
  int local_314;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2bc;
  ostream local_2a0 [548];
  int local_7c;
  int local_78;
  byte local_73;
  byte local_72;
  byte local_71;
  _Ios_Openmode local_60;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 *local_20;
  undefined1 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  local_71 = in_R8B & 1;
  local_72 = in_R9B & 1;
  local_73 = in_stack_00000008 & 1;
  local_60 = in_ESI;
  ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff9c8);
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1363b2);
  RVar11 = ::soplex::Tolerances::epsilon(peVar6);
  dVar12 = log10(RVar11);
  local_78 = (int)-dVar12;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x136402);
  local_7c = local_78 + 10;
  std::ofstream::ofstream(local_2a0);
  if ((local_73 & 1) == 0) {
    std::ofstream::open((char *)local_2a0,local_60);
  }
  else {
    std::ofstream::open((char *)local_2a0,local_60);
  }
  if ((local_71 & 1) != 0) {
    ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x1364c0);
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
    bVar2 = ::soplex::SoPlexBase<double>::getPrimalRay
                      (in_stack_fffffffffffff9d8,(VectorBase<double> *)in_stack_fffffffffffff9d0);
    if (bVar2) {
      std::operator<<(local_2a0,"\nPrimal ray (name, value):\n");
      for (local_2bc = 0; iVar1 = local_2bc,
          iVar5 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x136549),
          iVar1 < iVar5; local_2bc = local_2bc + 1) {
        ::soplex::VectorBase<double>::operator[]
                  ((VectorBase<double> *)in_stack_fffffffffffff9d0,
                   (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff9c8);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1365b3);
        ::soplex::Tolerances::epsilon(peVar6);
        bVar2 = ::soplex::isNotZero<double,double>
                          ((double)in_stack_fffffffffffff9d0,(double)in_stack_fffffffffffff9c8);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1365f3)
        ;
        if (bVar2) {
          pcVar9 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff9d0,
                              (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
          poVar10 = std::operator<<(local_2a0,pcVar9);
          poVar10 = std::operator<<(poVar10,"\t");
          local_2d4 = (int)std::setw(local_7c);
          poVar10 = std::operator<<(poVar10,(_Setw)local_2d4);
          local_2d8 = (int)std::setprecision(local_78);
          poVar10 = std::operator<<(poVar10,(_Setprecision)local_2d8);
          pdVar7 = ::soplex::VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffff9d0,
                              (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
          pvVar8 = (void *)std::ostream::operator<<(poVar10,*pdVar7);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        }
      }
      poVar10 = std::operator<<(local_2a0,"All other entries are zero (within ");
      local_2dc = (int)std::setprecision(1);
      poVar10 = std::operator<<(poVar10,(_Setprecision)local_2dc);
      pvVar8 = (void *)std::ostream::operator<<(poVar10,std::scientific);
      ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff9c8);
      peVar6 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1367f3);
      RVar11 = ::soplex::Tolerances::epsilon(peVar6);
      poVar10 = (ostream *)std::ostream::operator<<(pvVar8,RVar11);
      local_2f4 = (int)std::setprecision(8);
      poVar10 = std::operator<<(poVar10,(_Setprecision)local_2f4);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,std::fixed);
      poVar10 = std::operator<<(poVar10,").");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1368b4);
    }
    else {
      bVar2 = ::soplex::SoPlexBase<double>::isPrimalFeasible(in_stack_fffffffffffff9d0);
      if ((bVar2) &&
         (bVar2 = ::soplex::SoPlexBase<double>::getPrimal
                            (in_stack_fffffffffffff9d8,
                             (VectorBase<double> *)in_stack_fffffffffffff9d0), bVar2)) {
        local_2f8 = 0;
        std::operator<<(local_2a0,"\nPrimal solution (name, value):\n");
        for (local_2fc = 0; iVar1 = local_2fc,
            iVar5 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13697a),
            iVar1 < iVar5; local_2fc = local_2fc + 1) {
          ::soplex::VectorBase<double>::operator[]
                    ((VectorBase<double> *)in_stack_fffffffffffff9d0,
                     (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff9c8);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1369e4);
          ::soplex::Tolerances::epsilon(peVar6);
          bVar2 = ::soplex::isNotZero<double,double>
                            ((double)in_stack_fffffffffffff9d0,(double)in_stack_fffffffffffff9c8);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x136a24);
          if (bVar2) {
            pcVar9 = ::soplex::NameSet::operator[]
                               ((NameSet *)in_stack_fffffffffffff9d0,
                                (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
            poVar10 = std::operator<<(local_2a0,pcVar9);
            poVar10 = std::operator<<(poVar10,"\t");
            local_314 = (int)std::setw(local_7c);
            poVar10 = std::operator<<(poVar10,(_Setw)local_314);
            local_318 = (int)std::setprecision(local_78);
            poVar10 = std::operator<<(poVar10,(_Setprecision)local_318);
            pdVar7 = ::soplex::VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffff9d0,
                                (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
            pvVar8 = (void *)std::ostream::operator<<(poVar10,*pdVar7);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            local_2f8 = local_2f8 + 1;
          }
        }
        poVar10 = std::operator<<(local_2a0,"All other variables are zero (within ");
        local_31c = (int)std::setprecision(1);
        poVar10 = std::operator<<(poVar10,(_Setprecision)local_31c);
        pvVar8 = (void *)std::ostream::operator<<(poVar10,std::scientific);
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffff9c8);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x136c1c);
        RVar11 = ::soplex::Tolerances::epsilon(peVar6);
        poVar10 = (ostream *)std::ostream::operator<<(pvVar8,RVar11);
        local_334 = (int)std::setprecision(8);
        poVar10 = std::operator<<(poVar10,(_Setprecision)local_334);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,std::fixed);
        poVar10 = std::operator<<(poVar10,"). Solution has ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_2f8);
        poVar10 = std::operator<<(poVar10," nonzero entries.");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x136d19)
        ;
      }
      else {
        std::operator<<(local_2a0,"No primal information available.\n");
      }
    }
    ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x136d65);
  }
  if ((local_72 & 1) != 0) {
    ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x136d94);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase(in_stack_fffffffffffff9e0,(int)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
    bVar2 = ::soplex::SoPlexBase<double>::getPrimalRayRational
                      (in_stack_fffffffffffff9d8,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff9d0);
    if (bVar2) {
      std::operator<<(local_2a0,"\nPrimal ray (name, value):\n");
      for (local_354 = 0; iVar1 = local_354,
          iVar5 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x136e1d),
          iVar1 < iVar5; local_354 = local_354 + 1) {
        in_stack_fffffffffffffa60 =
             (ostream *)
             ::soplex::
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff9d0,
                          (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
        local_39c = 0;
        local_38 = local_398;
        local_40 = &local_39c;
        local_48 = 0;
        local_50 = 0;
        local_8 = local_40;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffffa28,(longlong *)in_stack_fffffffffffffa20,
                   (type *)CONCAT17(in_stack_fffffffffffffa1f,
                                    CONCAT16(in_stack_fffffffffffffa1e,
                                             CONCAT24(in_stack_fffffffffffffa1c,
                                                      in_stack_fffffffffffffa18))));
        in_stack_fffffffffffffa5f =
             boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffff9c8,
                        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x136ee4);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x136efa);
        if ((in_stack_fffffffffffffa5f & 1) != 0) {
          pcVar9 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff9d0,
                              (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
          poVar10 = std::operator<<(local_2a0,pcVar9);
          poVar10 = std::operator<<(poVar10,"\t");
          local_3a0 = (int)std::setw(local_7c);
          poVar10 = std::operator<<(poVar10,(_Setw)local_3a0);
          local_3a4 = (int)std::setprecision(local_78);
          std::operator<<(poVar10,(_Setprecision)local_3a4);
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20))
          ;
          in_stack_fffffffffffffa28 =
               boost::multiprecision::operator<<
                         (in_stack_fffffffffffffa60,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
          std::ostream::operator<<(in_stack_fffffffffffffa28,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      in_stack_fffffffffffffa20 = std::operator<<(local_2a0,"All other entries are zero.");
      std::ostream::operator<<(in_stack_fffffffffffffa20,std::endl<char,std::char_traits<char>>);
    }
    uVar3 = ::soplex::SoPlexBase<double>::isPrimalFeasible(in_stack_fffffffffffff9d0);
    if (((bool)uVar3) &&
       (uVar4 = ::soplex::SoPlexBase<double>::getPrimalRational
                          (in_stack_fffffffffffff9d8,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffff9d0), (bool)uVar4)) {
      local_3a8 = 0;
      std::operator<<(local_2a0,"\nPrimal solution (name, value):\n");
      for (local_3ac = 0; iVar1 = local_3ac,
          iVar5 = ::soplex::SoPlexBase<double>::numColsRational((SoPlexBase<double> *)0x137108),
          iVar1 < iVar5; local_3ac = local_3ac + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
        local_3fc = 0;
        local_18 = local_3f8;
        local_20 = &local_3fc;
        local_28 = 0;
        local_30 = 0;
        local_10 = local_20;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffffa28,(longlong *)in_stack_fffffffffffffa20,
                   (type *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffffa1c,iVar5)))
                  );
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff9c8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1371c0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1371d3);
        if (bVar2) {
          pcVar9 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff9d0,
                              (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
          poVar10 = std::operator<<(local_2a0,pcVar9);
          std::operator<<(poVar10,"\t");
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20))
          ;
          poVar10 = boost::multiprecision::operator<<
                              (in_stack_fffffffffffffa60,
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          local_3a8 = local_3a8 + 1;
        }
      }
      poVar10 = std::operator<<(local_2a0,"All other variables are zero. Solution has ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_3a8);
      poVar10 = std::operator<<(poVar10," nonzero entries.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::operator<<(local_2a0,"No primal (rational) solution available.\n");
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x13733b);
  }
  std::ofstream::~ofstream(local_2a0);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}